

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O2

Action __thiscall
psy::C::NameCataloger::visitIdentifierDeclarator
          (NameCataloger *this,IdentifierDeclaratorSyntax *node)

{
  NameCatalog *this_00;
  string local_70;
  SyntaxToken local_50;
  
  IdentifierDeclaratorSyntax::identifierToken(&local_50,node);
  SyntaxToken::valueText_abi_cxx11_(&local_70,&local_50);
  SyntaxToken::~SyntaxToken(&local_50);
  this_00 = (this->catalog_)._M_t.
            super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
            _M_t.
            super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
            .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl;
  if (this->withinTypedef_ == true) {
    NameCatalog::catalogUseAsTypeName(this_00,&local_70);
    NameCatalog::catalogDefAsTypeName
              ((this->catalog_)._M_t.
               super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
               .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,&local_70);
  }
  else {
    NameCatalog::catalogUseAsNonTypeName(this_00,&local_70);
    NameCatalog::catalogDefAsNonTypeName
              ((this->catalog_)._M_t.
               super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
               .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,&local_70);
  }
  SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
  std::__cxx11::string::~string((string *)&local_70);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    const auto& name = node->identifierToken().valueText();
    if (withinTypedef_) {
        catalog_->catalogUseAsTypeName(name);
        catalog_->catalogDefAsTypeName(name);
    } else {
        catalog_->catalogUseAsNonTypeName(name);
        catalog_->catalogDefAsNonTypeName(name);
    }

    visit(node->initializer());

    return Action::Skip;
}